

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O3

Diagnostic * __thiscall
slang::ast::EvalContext::addDiag(EvalContext *this,DiagCode code,SourceLocation location)

{
  DiagnosticSeverity DVar1;
  Diagnostic *diag;
  Diagnostics *this_00;
  
  DVar1 = getDefaultSeverity(code);
  this_00 = &this->warnings;
  if (2 < (int)DVar1) {
    this_00 = &this->diags;
  }
  diag = Diagnostics::add(this_00,code,location);
  reportStack(this,diag);
  return diag;
}

Assistant:

Diagnostic& EvalContext::addDiag(DiagCode code, SourceLocation location) {
    const bool isError = getDefaultSeverity(code) >= DiagnosticSeverity::Error;
    auto& diag = isError ? diags.add(code, location) : warnings.add(code, location);
    reportStack(diag);
    return diag;
}